

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_handlers.c
# Opt level: O1

dropt_error
dropt_handle_double(dropt_context *context,dropt_option *option,dropt_char *optionArgument,
                   void *dest)

{
  dropt_error dVar1;
  char *in_RAX;
  dropt_error *pdVar2;
  double dVar3;
  double dVar4;
  dropt_char *end;
  char *local_28;
  
  if (dest == (void *)0x0) {
    dropt_misuse("No handler destination specified.",
                 "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_handlers.c"
                 ,0x179);
    dVar1 = 2;
    dVar3 = 0.0;
  }
  else {
    dVar1 = 5;
    dVar3 = 0.0;
    if ((optionArgument != (dropt_char *)0x0) && (*optionArgument != '\0')) {
      local_28 = in_RAX;
      pdVar2 = (dropt_error *)__errno_location();
      *pdVar2 = 0;
      dVar3 = strtod(optionArgument,&local_28);
      dVar1 = 6;
      if ((optionArgument < local_28) && ((*local_28 == '\0' && (dVar1 = *pdVar2, dVar1 != 0)))) {
        if (dVar1 == 0x22) {
          dVar4 = -dVar3;
          if (-dVar3 <= dVar3) {
            dVar4 = dVar3;
          }
          dVar1 = 8 - (2.2250738585072014e-308 < dVar4);
        }
        else {
          dVar1 = 1;
        }
      }
    }
  }
  if (dVar1 == 0) {
    *(double *)dest = dVar3;
  }
  return dVar1;
}

Assistant:

dropt_error
dropt_handle_double(dropt_context* context,
                    const dropt_option* option,
                    const dropt_char* optionArgument,
                    void* dest)
{
    dropt_error err = dropt_error_none;
    double val = 0.0;
    double* out = dest;

    if (out == NULL)
    {
        DROPT_MISUSE("No handler destination specified.");
        err = dropt_error_bad_configuration;
    }
    else if (   optionArgument == NULL
             || optionArgument[0] == DROPT_TEXT_LITERAL('\0'))
    {
        err = dropt_error_insufficient_arguments;
    }
    else
    {
        dropt_char* end;
        errno = 0;
        val = dropt_strtod(optionArgument, &end);

        /* Check that we matched at least one digit.
         * (`strtod` will return 0 if fed a string with no digits.)
         */
        if (*end == DROPT_TEXT_LITERAL('\0') && end > optionArgument)
        {
            if (errno == ERANGE)
            {
                /* Note that setting `errno` to `ERANGE` for underflow errors
                 * is implementation-defined behavior, but glibc, BSD's
                 * libc, and Microsoft's CRT all have implementations of
                 * `strtod` documented to return 0 and to set `errno` to
                 * `ERANGE` for such cases.
                 */
                err = (ABS(val) <= DBL_MIN)
                      ? dropt_error_underflow
                      : dropt_error_overflow;
            }
            else if (errno != 0)
            {
                err = dropt_error_unknown;
            }
        }
        else
        {
            err = dropt_error_mismatch;
        }
    }

    if (err == dropt_error_none) { *out = val; }
    return err;
}